

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall sglr::ReferenceContext::clear(ReferenceContext *this,deUint32 buffers)

{
  ChannelOrder CVar1;
  bool bVar2;
  uint uVar3;
  ConstPixelBufferAccess *pCVar4;
  sbyte sVar5;
  int y;
  int iVar6;
  ConstPixelBufferAccess *pCVar7;
  int i;
  int iVar8;
  long lVar9;
  int iVar10;
  int z;
  int iVar11;
  ChannelOrder CVar12;
  ConstPixelBufferAccess *pCVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int z_00;
  MultisamplePixelBufferAccess access;
  Vec4 c;
  MultisamplePixelBufferAccess stencilBuf;
  MultisamplePixelBufferAccess depthBuf;
  MultisamplePixelBufferAccess colorBuf0;
  ConstPixelBufferAccess local_150;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  ConstPixelBufferAccess local_118;
  MultisamplePixelBufferAccess local_e8;
  MultisamplePixelBufferAccess local_b8;
  MultisamplePixelBufferAccess local_90;
  MultisamplePixelBufferAccess local_68;
  
  if ((buffers & 0xffffbaff) != 0) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x501;
    return;
  }
  getDrawColorbuffer(&local_68,this);
  getDrawDepthbuffer(&local_90,this);
  getDrawStencilbuffer(&local_b8,this);
  iVar14 = 0x7fffffff;
  iVar10 = 0x7fffffff;
  iVar16 = 0;
  iVar11 = 0;
  if (this->m_scissorEnabled == true) {
    iVar11 = (this->m_scissorBox).m_data[0];
    iVar16 = (this->m_scissorBox).m_data[1];
    iVar10 = (this->m_scissorBox).m_data[2];
    iVar14 = (this->m_scissorBox).m_data[3];
  }
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&local_150,&local_68);
  iVar8 = 0;
  if (0 < iVar11) {
    iVar8 = iVar11;
  }
  y = 0;
  if (0 < iVar16) {
    y = iVar16;
  }
  iVar10 = iVar10 + iVar11;
  iVar11 = local_150.m_size.m_data[1];
  if (iVar10 < local_150.m_size.m_data[1]) {
    iVar11 = iVar10;
  }
  iVar14 = iVar14 + iVar16;
  iVar16 = local_150.m_size.m_data[2];
  if (iVar14 < local_150.m_size.m_data[2]) {
    iVar16 = iVar14;
  }
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&local_150,&local_90);
  iVar15 = local_150.m_size.m_data[1];
  if (iVar10 < local_150.m_size.m_data[1]) {
    iVar15 = iVar10;
  }
  iVar17 = local_150.m_size.m_data[2];
  if (iVar14 < local_150.m_size.m_data[2]) {
    iVar17 = iVar14;
  }
  iVar15 = iVar15 - iVar8;
  iVar17 = iVar17 - y;
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&local_150,&local_b8);
  if (local_150.m_size.m_data[1] <= iVar10) {
    iVar10 = local_150.m_size.m_data[1];
  }
  if (local_150.m_size.m_data[2] <= iVar14) {
    iVar14 = local_150.m_size.m_data[2];
  }
  iVar10 = iVar10 - iVar8;
  iVar14 = iVar14 - y;
  local_124 = iVar15;
  if (iVar15 < 1) {
    local_124 = 0;
  }
  local_128 = iVar17;
  if (iVar17 < 1) {
    local_128 = 0;
  }
  local_120 = iVar10;
  if (iVar10 < 1) {
    local_120 = 0;
  }
  local_11c = iVar14;
  if (iVar14 < 1) {
    local_11c = 0;
  }
  if (((0x3fff < buffers) && (0 < iVar11 - iVar8)) && (0 < iVar16 - y)) {
    rr::getSubregion((MultisamplePixelBufferAccess *)&local_150,&local_68,iVar8,y,iVar11 - iVar8,
                     iVar16 - y);
    bVar2 = tcu::isSRGB(local_68.m_access.super_ConstPixelBufferAccess.m_format);
    if ((bVar2) && (this->m_sRGBUpdateEnabled == true)) {
      tcu::linearToSRGB((tcu *)&local_118,&this->m_clearColor);
    }
    else {
      local_118.m_format.order = (ChannelOrder)(this->m_clearColor).m_data[0];
      local_118.m_format.type = (ChannelType)(this->m_clearColor).m_data[1];
      local_118.m_size.m_data._0_8_ = *(undefined8 *)((this->m_clearColor).m_data + 2);
    }
    bVar2 = (this->m_colorMask).m_data[1];
    if ((this->m_colorMask).m_data[0] == true) {
      if (((bVar2 == false) || ((this->m_colorMask).m_data[2] != true)) ||
         (((this->m_colorMask).m_data[3] & 1U) == 0)) {
LAB_00819db5:
        if (0 < local_150.m_size.m_data[2]) {
          z = 0;
          iVar11 = local_150.m_size.m_data[2];
          iVar16 = local_150.m_size.m_data[1];
          do {
            if (0 < iVar16) {
              z_00 = 0;
              iVar6 = local_150.m_size.m_data[0];
              do {
                if (0 < iVar6) {
                  iVar11 = 0;
                  do {
                    tcu::ConstPixelBufferAccess::getPixel
                              ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)&local_150,
                               iVar11,z_00);
                    local_e8.m_access.super_ConstPixelBufferAccess.m_format.order = R;
                    local_e8.m_access.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
                    local_e8.m_access.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
                    local_e8.m_access.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
                    pCVar4 = &local_118;
                    lVar9 = 0;
                    pCVar7 = (ConstPixelBufferAccess *)&stack0xffffffffffffffc0;
                    do {
                      pCVar13 = pCVar4;
                      if ((this->m_colorMask).m_data[lVar9] == false) {
                        pCVar13 = pCVar7;
                      }
                      local_e8.m_access.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2] =
                           (pCVar13->m_format).order;
                      lVar9 = lVar9 + 1;
                      pCVar7 = (ConstPixelBufferAccess *)&(pCVar7->m_format).type;
                      pCVar4 = (ConstPixelBufferAccess *)&(pCVar4->m_format).type;
                    } while (lVar9 != 4);
                    tcu::PixelBufferAccess::setPixel
                              ((PixelBufferAccess *)&local_150,(Vec4 *)&local_e8,iVar11,z_00,z);
                    iVar11 = iVar11 + 1;
                    iVar16 = local_150.m_size.m_data[1];
                    iVar6 = local_150.m_size.m_data[0];
                  } while (iVar11 < local_150.m_size.m_data[0]);
                }
                z_00 = z_00 + 1;
                iVar11 = local_150.m_size.m_data[2];
              } while (z_00 < iVar16);
            }
            z = z + 1;
          } while (z < iVar11);
        }
      }
      else {
        rr::clear((MultisamplePixelBufferAccess *)&local_150,(Vec4 *)&local_118);
      }
    }
    else if (((bVar2 != false) || ((this->m_colorMask).m_data[2] != false)) ||
            ((this->m_colorMask).m_data[3] != false)) goto LAB_00819db5;
  }
  if (((buffers >> 8 & 1) != 0 && (0 < iVar17 && 0 < iVar15)) && (this->m_depthMask == true)) {
    rr::getSubregion(&local_e8,&local_90,iVar8,y,local_124,local_128);
    tcu::getEffectiveDepthStencilAccess
              ((PixelBufferAccess *)&local_150,&local_e8.m_access,MODE_DEPTH);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)&local_150);
    rr::clearDepth((MultisamplePixelBufferAccess *)&local_118,this->m_clearDepth);
  }
  if ((buffers >> 10 & 1) == 0 || (iVar10 < 1 || iVar14 < 1)) {
    return;
  }
  rr::getSubregion(&local_e8,&local_b8,iVar8,y,local_120,local_11c);
  tcu::getEffectiveDepthStencilAccess
            ((PixelBufferAccess *)&local_150,&local_e8.m_access,MODE_STENCIL);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)&local_150);
  if (local_b8.m_access.super_ConstPixelBufferAccess.m_format.order == DS) {
    sVar5 = (local_b8.m_access.super_ConstPixelBufferAccess.m_format.type ==
             FLOAT_UNSIGNED_INT_24_8_REV ||
            local_b8.m_access.super_ConstPixelBufferAccess.m_format.type == UNSIGNED_INT_24_8) << 3;
  }
  else {
    sVar5 = 0;
    if (local_b8.m_access.super_ConstPixelBufferAccess.m_format.order == S) {
      if (local_b8.m_access.super_ConstPixelBufferAccess.m_format.type == UNSIGNED_INT8) {
        sVar5 = 8;
      }
      else {
        if (local_b8.m_access.super_ConstPixelBufferAccess.m_format.type == UNSIGNED_INT32) {
          CVar12 = ~R;
          uVar3 = 0x21;
          goto LAB_00819fbd;
        }
        if (local_b8.m_access.super_ConstPixelBufferAccess.m_format.type == UNSIGNED_INT16) {
          sVar5 = 0x10;
        }
      }
    }
  }
  uVar3 = -1 << sVar5;
  CVar12 = ~uVar3;
LAB_00819fbd:
  CVar12 = CVar12 & this->m_clearStencil;
  if ((uVar3 | this->m_stencil[0].writeMask) == 0xffffffff) {
    rr::clearStencil((MultisamplePixelBufferAccess *)&local_118,CVar12);
  }
  else if (0 < local_118.m_size.m_data[2]) {
    iVar10 = 0;
    iVar11 = local_118.m_size.m_data[2];
    iVar16 = local_118.m_size.m_data[1];
    do {
      if (0 < iVar16) {
        iVar8 = 0;
        iVar14 = local_118.m_size.m_data[0];
        do {
          if (0 < iVar14) {
            iVar11 = 0;
            do {
              CVar1 = this->m_stencil[0].writeMask;
              tcu::ConstPixelBufferAccess::getPixelInt(&local_150,(int)&local_118,iVar11,iVar8);
              local_150.m_format.order =
                   (CVar12 ^ local_150.m_format.order) & CVar1 ^ local_150.m_format.order;
              local_150.m_format.type = SNORM_INT8;
              local_150.m_size.m_data[0] = 0;
              local_150.m_size.m_data[1] = 0;
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&local_118,(IVec4 *)&local_150,iVar11,iVar8,iVar10);
              iVar11 = iVar11 + 1;
            } while (iVar11 < local_118.m_size.m_data[0]);
            iVar16 = local_118.m_size.m_data[1];
            iVar14 = local_118.m_size.m_data[0];
          }
          iVar8 = iVar8 + 1;
          iVar11 = local_118.m_size.m_data[2];
        } while (iVar8 < iVar16);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < iVar11);
  }
  return;
}

Assistant:

void ReferenceContext::clear (deUint32 buffers)
{
	RC_IF_ERROR((buffers & ~(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) != 0, GL_INVALID_VALUE, RC_RET_VOID);

	rr::MultisamplePixelBufferAccess	colorBuf0	= getDrawColorbuffer();
	rr::MultisamplePixelBufferAccess	depthBuf	= getDrawDepthbuffer();
	rr::MultisamplePixelBufferAccess	stencilBuf	= getDrawStencilbuffer();
	IVec4								baseArea	= m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);
	IVec4								colorArea	= intersect(baseArea, getBufferRect(colorBuf0));
	IVec4								depthArea	= intersect(baseArea, getBufferRect(depthBuf));
	IVec4								stencilArea	= intersect(baseArea, getBufferRect(stencilBuf));
	bool								hasColor0	= !isEmpty(colorArea);
	bool								hasDepth	= !isEmpty(depthArea);
	bool								hasStencil	= !isEmpty(stencilArea);

	if (hasColor0 && (buffers & GL_COLOR_BUFFER_BIT) != 0)
	{
		rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf0, colorArea.x(), colorArea.y(), colorArea.z(), colorArea.w());
		bool								isSRGB		= tcu::isSRGB(colorBuf0.raw().getFormat());
		Vec4								c			= (isSRGB && m_sRGBUpdateEnabled) ? tcu::linearToSRGB(m_clearColor) : m_clearColor;
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];

		if (!maskUsed)
			rr::clear(access, c);
		else if (!maskZero)
		{
			for (int y = 0; y < access.raw().getDepth(); y++)
				for (int x = 0; x < access.raw().getHeight(); x++)
					for (int s = 0; s < access.getNumSamples(); s++)
						access.raw().setPixel(tcu::select(c, access.raw().getPixel(s, x, y), m_colorMask), s, x, y);
		}
		// else all channels masked out
	}

	if (hasDepth && (buffers & GL_DEPTH_BUFFER_BIT) != 0 && m_depthMask)
	{
		rr::MultisamplePixelBufferAccess access = getDepthMultisampleAccess(rr::getSubregion(depthBuf, depthArea.x(), depthArea.y(), depthArea.z(), depthArea.w()));
		rr::clearDepth(access, m_clearDepth);
	}

	if (hasStencil && (buffers & GL_STENCIL_BUFFER_BIT) != 0)
	{
		rr::MultisamplePixelBufferAccess	access					= getStencilMultisampleAccess(rr::getSubregion(stencilBuf, stencilArea.x(), stencilArea.y(), stencilArea.z(), stencilArea.w()));
		int									stencilBits				= getNumStencilBits(stencilBuf.raw().getFormat());
		int									stencil					= maskStencil(stencilBits, m_clearStencil);

		if ((m_stencil[rr::FACETYPE_FRONT].writeMask & ((1u<<stencilBits)-1u)) != ((1u<<stencilBits)-1u))
		{
			// Slow path where depth or stencil is masked out in write.
			for (int y = 0; y < access.raw().getDepth(); y++)
				for (int x = 0; x < access.raw().getHeight(); x++)
					for (int s = 0; s < access.getNumSamples(); s++)
						writeMaskedStencil(access, s, x, y, stencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
		}
		else
			rr::clearStencil(access, stencil);
	}
}